

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O3

boolean resists_blnd(monst *mon)

{
  permonst *ppVar1;
  obj *poVar2;
  boolean bVar3;
  ulong uVar4;
  obj **ppoVar5;
  
  ppVar1 = mon->data;
  if (mon != &youmonst) {
    if (mon->mblinded != '\0') {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) == 0) {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 & 0x80000) != 0 || (ppVar1->mflags1 & 0x1000) != 0) {
      return '\x01';
    }
    goto LAB_001edd23;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001edce9;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001edce0;
  }
  else {
LAB_001edce0:
    if (ublindf == (obj *)0x0) {
      return '\x01';
    }
LAB_001edce9:
    if (ublindf->oartifact != '\x1d') {
      return '\x01';
    }
  }
  if (u.usleep != 0) {
    return '\x01';
  }
LAB_001edd23:
  uVar4 = 0xc;
  do {
    if ((*(char *)((long)ppVar1->mattk + (uVar4 - 0xb)) == '\v') &&
       (*(char *)((long)(ppVar1->mattk + -3) + uVar4) == '\r')) {
      return '\x01';
    }
    uVar4 = uVar4 + 4;
  } while (uVar4 < 0x24);
  uVar4 = 0xc;
  do {
    if ((*(char *)((long)ppVar1->mattk + (uVar4 - 0xb)) == '\v') &&
       (*(char *)((long)(ppVar1->mattk + -3) + uVar4) == '\x0f')) {
      return '\x01';
    }
    uVar4 = uVar4 + 4;
  } while (uVar4 < 0x24);
  if (mon == &youmonst) {
    ppoVar5 = &uwep;
  }
  else {
    ppoVar5 = &mon->mw;
  }
  poVar2 = *ppoVar5;
  if (((poVar2 != (obj *)0x0) && (poVar2->oartifact != '\0')) &&
     (bVar3 = defends(0xb,poVar2), bVar3 != '\0')) {
    return '\x01';
  }
  if (mon == &youmonst) {
    ppoVar5 = &invent;
  }
  else {
    ppoVar5 = &mon->minvent;
  }
  poVar2 = *ppoVar5;
  while( true ) {
    if (poVar2 == (obj *)0x0) {
      return '\0';
    }
    if ((poVar2->oartifact != '\0') && (bVar3 = protects(0xb,poVar2), bVar3 != '\0')) break;
    poVar2 = poVar2->nobj;
  }
  return '\x01';
}

Assistant:

boolean resists_blnd(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	boolean is_you = (mon == &youmonst);
	struct obj *o;

	if (is_you ? (Blind || u.usleep) :
		(mon->mblinded || !mon->mcansee || !haseyes(ptr) ||
		    /* BUG: temporary sleep sets mfrozen, but since
			    paralysis does too, we can't check it */
		    mon->msleeping))
	    return TRUE;
	/* yellow light, Archon; !dust vortex, !cobra, !raven */
	if (dmgtype_fromattack(ptr, AD_BLND, AT_EXPL) ||
		dmgtype_fromattack(ptr, AD_BLND, AT_GAZE))
	    return TRUE;
	o = is_you ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_BLND, o))
	    return TRUE;
	o = is_you ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if (o->oartifact && protects(AD_BLND, o))
		return TRUE;
	return FALSE;
}